

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

nghttp2_ssize
hd_inflate_read_len(nghttp2_hd_inflater *inflater,int *rfin,uint8_t *in,uint8_t *last,size_t prefix,
                   size_t maxlen)

{
  uint8_t *in_RCX;
  uint8_t *in_RDX;
  int *in_RSI;
  long in_RDI;
  size_t in_R8;
  ulong in_R9;
  uint32_t out;
  nghttp2_ssize rv;
  uint local_44 [3];
  ulong local_38;
  long local_10;
  nghttp2_ssize local_8;
  
  *in_RSI = 0;
  local_38 = in_R9;
  local_10 = in_RDI;
  local_8 = decode_length(local_44,(size_t *)(in_RDI + 0xd8),in_RSI,
                          (uint32_t)*(undefined8 *)(in_RDI + 0xb8),*(size_t *)(in_RDI + 0xd8),in_RDX
                          ,in_RCX,in_R8);
  if (local_8 == -1) {
    local_8 = -0x20b;
  }
  else if (local_38 < local_44[0]) {
    local_8 = -0x20b;
  }
  else {
    *(ulong *)(local_10 + 0xb8) = (ulong)local_44[0];
  }
  return local_8;
}

Assistant:

static nghttp2_ssize hd_inflate_read_len(nghttp2_hd_inflater *inflater,
                                         int *rfin, const uint8_t *in,
                                         const uint8_t *last, size_t prefix,
                                         size_t maxlen) {
  nghttp2_ssize rv;
  uint32_t out;

  *rfin = 0;

  rv = decode_length(&out, &inflater->shift, rfin, (uint32_t)inflater->left,
                     inflater->shift, in, last, prefix);

  if (rv == -1) {
    DEBUGF("inflatehd: integer decoding failed\n");
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (out > maxlen) {
    DEBUGF("inflatehd: integer exceeded the maximum value %zu\n", maxlen);
    return NGHTTP2_ERR_HEADER_COMP;
  }

  inflater->left = out;

  DEBUGF("inflatehd: decoded integer is %u\n", out);

  return rv;
}